

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_locate_header_sig
                  (mz_zip_archive *pZip,mz_uint32 record_sig,mz_uint32 record_size,mz_int64 *pOfs)

{
  size_t sVar1;
  mz_uint64 local_1068;
  ulong local_1060;
  mz_uint64 local_1058;
  mz_uint s;
  int n;
  int i;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  mz_uint64 local_30;
  mz_int64 cur_file_ofs;
  mz_int64 *pOfs_local;
  mz_uint32 record_size_local;
  mz_uint32 record_sig_local;
  mz_zip_archive *pZip_local;
  
  if ((ulong)record_size <= pZip->m_archive_size) {
    if ((long)(pZip->m_archive_size - 0x1000) < 1) {
      local_1058 = 0;
    }
    else {
      local_1058 = pZip->m_archive_size - 0x1000;
    }
    local_30 = local_1058;
    while( true ) {
      if (pZip->m_archive_size - local_30 < 0x1001) {
        local_1060 = pZip->m_archive_size - local_30;
      }
      else {
        local_1060 = 0x1000;
      }
      sVar1 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_30,&pBuf,(long)(int)local_1060);
      if (sVar1 != (local_1060 & 0xffffffff)) {
        return 0;
      }
      for (s = (int)local_1060 - 4;
          (-1 < (int)s &&
          ((CONCAT13(*(undefined1 *)((long)buf_u32 + (long)(int)s + -5),
                     CONCAT12(*(undefined1 *)((long)buf_u32 + (long)(int)s + -6),
                              CONCAT11(*(undefined1 *)((long)buf_u32 + (long)(int)s + -7),
                                       *(undefined1 *)((long)&pBuf + (long)(int)s)))) != record_sig
           || (pZip->m_archive_size - (local_30 + (long)(int)s) < (ulong)record_size)))); s = s - 1)
      {
      }
      if (-1 < (int)s) {
        *pOfs = (long)(int)s + local_30;
        return 1;
      }
      if ((local_30 == 0) || ((ulong)record_size + 0xffff <= pZip->m_archive_size - local_30))
      break;
      if (local_30 == 0xffd) {
        local_1068 = 0;
      }
      else {
        local_1068 = local_30 - 0xffd;
      }
      local_30 = local_1068;
    }
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_reader_locate_header_sig(mz_zip_archive *pZip,
                                               mz_uint32 record_sig,
                                               mz_uint32 record_size,
                                               mz_int64 *pOfs) {
  mz_int64 cur_file_ofs;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;

  /* Basic sanity checks - reject files which are too small */
  if (pZip->m_archive_size < record_size)
    return MZ_FALSE;

  /* Find the record by scanning the file from the end towards the beginning. */
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);

    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;

    for (i = n - 4; i >= 0; --i) {
      mz_uint s = MZ_READ_LE32(pBuf + i);
      if (s == record_sig) {
        if ((pZip->m_archive_size - (cur_file_ofs + i)) >= record_size)
          break;
      }
    }

    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }

    /* Give up if we've searched the entire file, or we've gone back "too far"
     * (~64kb) */
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            ((mz_uint64)(MZ_UINT16_MAX) + record_size)))
      return MZ_FALSE;

    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }

  *pOfs = cur_file_ofs;
  return MZ_TRUE;
}